

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *os;
  size_t sVar2;
  ostream *poVar3;
  pointer pSVar4;
  Colour colourGuard;
  SourceLineInfo lineInfo;
  char local_2a [2];
  SourceLineInfo local_28;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                         currentTestCaseInfo.super_Option<Catch::TestCaseInfo>.nullableValue)->name)
  ;
  if (1 < (ulong)(((long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333)) {
    local_28.file = (char *)((ulong)local_28.file & 0xffffffffffffff00);
    Colour::use(Headers);
    pSVar4 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar4 = pSVar4 + 1, pSVar4 != pSVar1) {
      printHeaderString(this,&pSVar4->name,2);
    }
    Colour::use(None);
  }
  pSVar4 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_28.file = pSVar4[-1].lineInfo.file;
  local_28.line = pSVar4[-1].lineInfo.line;
  poVar3 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000297810 = 0x2d2d2d2d2d2d2d;
    uRam0000000000297817._0_1_ = '-';
    uRam0000000000297817._1_1_ = '-';
    uRam0000000000297817._2_1_ = '-';
    uRam0000000000297817._3_1_ = '-';
    uRam0000000000297817._4_1_ = '-';
    uRam0000000000297817._5_1_ = '-';
    uRam0000000000297817._6_1_ = '-';
    uRam0000000000297817._7_1_ = '-';
    DAT_00297800 = '-';
    DAT_00297800_1._0_1_ = '-';
    DAT_00297800_1._1_1_ = '-';
    DAT_00297800_1._2_1_ = '-';
    DAT_00297800_1._3_1_ = '-';
    DAT_00297800_1._4_1_ = '-';
    DAT_00297800_1._5_1_ = '-';
    DAT_00297800_1._6_1_ = '-';
    uRam0000000000297808 = 0x2d2d2d2d2d2d2d;
    DAT_0029780f = 0x2d;
    DAT_002977f0 = '-';
    DAT_002977f0_1._0_1_ = '-';
    DAT_002977f0_1._1_1_ = '-';
    DAT_002977f0_1._2_1_ = '-';
    DAT_002977f0_1._3_1_ = '-';
    DAT_002977f0_1._4_1_ = '-';
    DAT_002977f0_1._5_1_ = '-';
    DAT_002977f0_1._6_1_ = '-';
    uRam00000000002977f8._0_1_ = '-';
    uRam00000000002977f8._1_1_ = '-';
    uRam00000000002977f8._2_1_ = '-';
    uRam00000000002977f8._3_1_ = '-';
    uRam00000000002977f8._4_1_ = '-';
    uRam00000000002977f8._5_1_ = '-';
    uRam00000000002977f8._6_1_ = '-';
    uRam00000000002977f8._7_1_ = '-';
    DAT_002977e0 = '-';
    DAT_002977e0_1._0_1_ = '-';
    DAT_002977e0_1._1_1_ = '-';
    DAT_002977e0_1._2_1_ = '-';
    DAT_002977e0_1._3_1_ = '-';
    DAT_002977e0_1._4_1_ = '-';
    DAT_002977e0_1._5_1_ = '-';
    DAT_002977e0_1._6_1_ = '-';
    uRam00000000002977e8._0_1_ = '-';
    uRam00000000002977e8._1_1_ = '-';
    uRam00000000002977e8._2_1_ = '-';
    uRam00000000002977e8._3_1_ = '-';
    uRam00000000002977e8._4_1_ = '-';
    uRam00000000002977e8._5_1_ = '-';
    uRam00000000002977e8._6_1_ = '-';
    uRam00000000002977e8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000002977d8._0_1_ = '-';
    uRam00000000002977d8._1_1_ = '-';
    uRam00000000002977d8._2_1_ = '-';
    uRam00000000002977d8._3_1_ = '-';
    uRam00000000002977d8._4_1_ = '-';
    uRam00000000002977d8._5_1_ = '-';
    uRam00000000002977d8._6_1_ = '-';
    uRam00000000002977d8._7_1_ = '-';
    DAT_0029781f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  local_2a[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2a,1);
  local_2a[1] = 0;
  Colour::use(FileName);
  os = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  Catch::operator<<(os,&local_28);
  local_2a[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,local_2a,1);
  poVar3 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000002978b0 = 0x2e2e2e2e2e2e2e;
    uRam00000000002978b7._0_1_ = '.';
    uRam00000000002978b7._1_1_ = '.';
    uRam00000000002978b7._2_1_ = '.';
    uRam00000000002978b7._3_1_ = '.';
    uRam00000000002978b7._4_1_ = '.';
    uRam00000000002978b7._5_1_ = '.';
    uRam00000000002978b7._6_1_ = '.';
    uRam00000000002978b7._7_1_ = '.';
    DAT_002978a0 = '.';
    DAT_002978a0_1._0_1_ = '.';
    DAT_002978a0_1._1_1_ = '.';
    DAT_002978a0_1._2_1_ = '.';
    DAT_002978a0_1._3_1_ = '.';
    DAT_002978a0_1._4_1_ = '.';
    DAT_002978a0_1._5_1_ = '.';
    DAT_002978a0_1._6_1_ = '.';
    uRam00000000002978a8 = 0x2e2e2e2e2e2e2e;
    DAT_002978af = 0x2e;
    DAT_00297890 = '.';
    DAT_00297890_1._0_1_ = '.';
    DAT_00297890_1._1_1_ = '.';
    DAT_00297890_1._2_1_ = '.';
    DAT_00297890_1._3_1_ = '.';
    DAT_00297890_1._4_1_ = '.';
    DAT_00297890_1._5_1_ = '.';
    DAT_00297890_1._6_1_ = '.';
    uRam0000000000297898._0_1_ = '.';
    uRam0000000000297898._1_1_ = '.';
    uRam0000000000297898._2_1_ = '.';
    uRam0000000000297898._3_1_ = '.';
    uRam0000000000297898._4_1_ = '.';
    uRam0000000000297898._5_1_ = '.';
    uRam0000000000297898._6_1_ = '.';
    uRam0000000000297898._7_1_ = '.';
    DAT_00297880 = '.';
    DAT_00297880_1._0_1_ = '.';
    DAT_00297880_1._1_1_ = '.';
    DAT_00297880_1._2_1_ = '.';
    DAT_00297880_1._3_1_ = '.';
    DAT_00297880_1._4_1_ = '.';
    DAT_00297880_1._5_1_ = '.';
    DAT_00297880_1._6_1_ = '.';
    uRam0000000000297888._0_1_ = '.';
    uRam0000000000297888._1_1_ = '.';
    uRam0000000000297888._2_1_ = '.';
    uRam0000000000297888._3_1_ = '.';
    uRam0000000000297888._4_1_ = '.';
    uRam0000000000297888._5_1_ = '.';
    uRam0000000000297888._6_1_ = '.';
    uRam0000000000297888._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000297878._0_1_ = '.';
    uRam0000000000297878._1_1_ = '.';
    uRam0000000000297878._2_1_ = '.';
    uRam0000000000297878._3_1_ = '.';
    uRam0000000000297878._4_1_ = '.';
    uRam0000000000297878._5_1_ = '.';
    uRam0000000000297878._6_1_ = '.';
    uRam0000000000297878._7_1_ = '.';
    DAT_002978bf = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  local_2a[0] = '\n';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_2a,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    stream << getLineOfChars<'-'>() << '\n';
    Colour colourGuard(Colour::FileName);
    stream << lineInfo << '\n';
    stream << getLineOfChars<'.'>() << '\n' << std::endl;
}